

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O0

ReturnStatementSyntax * __thiscall
slang::parsing::Parser::parseReturnStatement
          (Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  Token returnKeyword;
  bool bVar1;
  pointer ppAVar2;
  ReturnStatementSyntax *pRVar3;
  __extent_storage<18446744073709551615UL> in_RSI;
  long in_RDI;
  Token semi_00;
  Token TVar4;
  Token semi;
  ExpressionSyntax *expr;
  Token keyword;
  Parser *in_stack_ffffffffffffff30;
  undefined6 uVar5;
  TokenKind in_stack_ffffffffffffff3e;
  undefined2 uVar6;
  ParserBase *in_stack_ffffffffffffff40;
  ParserBase *in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffffb8 [16];
  unkbyte10 Var7;
  
  Var7 = in_stack_ffffffffffffffb8._6_10_;
  semi_00 = ParserBase::consume(in_stack_ffffffffffffff50);
  bVar1 = ParserBase::peek(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3e);
  if (!bVar1) {
    parseExpression(in_stack_ffffffffffffff30);
  }
  TVar4 = ParserBase::expect((ParserBase *)((unkuint10)Var7 >> 0x10),(TokenKind)Var7);
  ppAVar2 = (pointer)(in_RDI + 0xe0);
  uVar5 = SUB86(ppAVar2,0);
  uVar6 = (undefined2)((ulong)ppAVar2 >> 0x30);
  elements._M_extent._M_extent_value = in_RSI._M_extent_value;
  elements._M_ptr = ppAVar2;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_ffffffffffffff30,
             elements);
  returnKeyword.info = TVar4._0_8_;
  returnKeyword.kind = (short)in_RDI;
  returnKeyword._2_1_ = (char)((ulong)in_RDI >> 0x10);
  returnKeyword.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  returnKeyword.rawLen = (int)((ulong)in_RDI >> 0x20);
  pRVar3 = slang::syntax::SyntaxFactory::returnStatement
                     ((SyntaxFactory *)in_RSI._M_extent_value,
                      (NamedLabelSyntax *)CONCAT26(uVar6,uVar5),
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)TVar4.info,returnKeyword
                      ,(ExpressionSyntax *)TVar4._0_8_,semi_00);
  return pRVar3;
}

Assistant:

ReturnStatementSyntax& Parser::parseReturnStatement(NamedLabelSyntax* label, AttrList attributes) {
    auto keyword = consume();

    ExpressionSyntax* expr = nullptr;
    if (!peek(TokenKind::Semicolon))
        expr = &parseExpression();

    auto semi = expect(TokenKind::Semicolon);
    return factory.returnStatement(label, attributes, keyword, expr, semi);
}